

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::StringSink::~StringSink(StringSink *this)

{
  StringSink *this_local;
  
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)&PTR__StringSink_001f4048;
  std::__cxx11::string::~string((string *)&this->contents_);
  WritableFile::~WritableFile(&this->super_WritableFile);
  return;
}

Assistant:

~StringSink() override = default;